

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

string * google::protobuf::internal::VersionString_abi_cxx11_(int version)

{
  int in_ESI;
  string *in_RDI;
  char buffer [128];
  int micro;
  int minor;
  int major;
  allocator local_99;
  char local_98 [127];
  undefined1 local_19;
  uint local_18;
  uint local_14;
  uint local_10;
  
  local_10 = in_ESI / 1000000;
  local_14 = (in_ESI / 1000) % 1000;
  local_18 = in_ESI % 1000;
  snprintf(local_98,0x80,"%d.%d.%d",(ulong)local_10,(ulong)local_14,(ulong)local_18);
  local_19 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_98,&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return in_RDI;
}

Assistant:

string VersionString(int version) {
  int major = version / 1000000;
  int minor = (version / 1000) % 1000;
  int micro = version % 1000;

  // 128 bytes should always be enough, but we use snprintf() anyway to be
  // safe.
  char buffer[128];
  snprintf(buffer, sizeof(buffer), "%d.%d.%d", major, minor, micro);

  // Guard against broken MSVC snprintf().
  buffer[sizeof(buffer)-1] = '\0';

  return buffer;
}